

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

PyObject * PyInit_trodesnetwork(void)

{
  int iVar1;
  PyObject *pPVar2;
  
  if (PyInit_trodesnetwork::moduledef == '\0') {
    iVar1 = __cxa_guard_acquire(&PyInit_trodesnetwork::moduledef);
    if (iVar1 != 0) {
      memcpy(&PyInit_trodesnetwork::moduledef,&PyInit_trodesnetwork::initial_m_base,0x28);
      PyInit_trodesnetwork::moduledef.m_name = "trodesnetwork";
      PyInit_trodesnetwork::moduledef.m_doc = (char *)0x0;
      PyInit_trodesnetwork::moduledef.m_size = -1;
      PyInit_trodesnetwork::moduledef.m_methods = PyInit_trodesnetwork::initial_methods;
      PyInit_trodesnetwork::moduledef.m_slots = (PyModuleDef_Slot *)0x0;
      PyInit_trodesnetwork::moduledef.m_traverse = (traverseproc)0x0;
      PyInit_trodesnetwork::moduledef.m_clear = (inquiry)0x0;
      PyInit_trodesnetwork::moduledef.m_free = (freefunc)0x0;
      __cxa_guard_release(&PyInit_trodesnetwork::moduledef);
    }
  }
  pPVar2 = (PyObject *)
           boost::python::detail::init_module
                     (&PyInit_trodesnetwork::moduledef,init_module_trodesnetwork);
  return pPVar2;
}

Assistant:

BOOST_PYTHON_MODULE(trodesnetwork){
    PyEval_InitThreads();
    Py_Initialize();
    np::initialize();
    to_python_converter<std::vector<std::string>, vecToList<std::string> >();
    to_python_converter<std::vector<byte>, vecToList<byte> >();
    to_python_converter<std::vector<int>, vecToList<int> >();
    to_python_converter<std::vector<EventDataType>, EventVecToDict>();
    to_python_converter<std::vector<HighFreqDataType>, vecToList<HighFreqDataType> >();
    to_python_converter<TrodesMsg, TrodesMsgToList>();
    to_python_converter<lfpPacket, lfpPacketToList>();

    scope().attr("TRODES_NETWORK_ID") = TRODES_NETWORK_ID;
    scope().attr("DEFAULT_SERVER_ADDRESS") = DEFAULT_SERVER_ADDRESS;
    scope().attr("DEFAULT_SERVER_PORT") = DEFAULT_SERVER_PORT;
    scope().attr("NEURALSTREAM") = hfType_NEURO;
    scope().attr("ANALOGSTREAM") = hfType_ANALOG;
    scope().attr("DIGITALSTREAM") = hfType_DIGITAL;
    scope().attr("SPIKESTREAM") = hfType_SPIKE;
    scope().attr("LFPSTREAM") = hfType_LFP;
    scope().attr("acq_PLAY") = acq_PLAY;
    scope().attr("acq_STOP") = acq_STOP;
    scope().attr("acq_PAUSE") = acq_PAUSE;
    scope().attr("acq_SEEK") = acq_SEEK;

//    scope().attr("settle_CMD") = settle_CMD;

    class_<timestamp_t>("timestamp_t")
            .add_property("trodes_timestamp", &timestamp_t::trodes_timestamp)
            .add_property("system_timestamp", &timestamp_t::system_timestamp)
            ;
    def("systemTimeMSecs", &CZHelp::systemTimeMSecs);

    class_<HighFreqDataType>
            ("HighFreqDataType")
            .add_property("name", &HighFreqDataType::getName, &HighFreqDataType::setName)
            .add_property("origin", &HighFreqDataType::getOrigin, &HighFreqDataType::setOrigin)
            .add_property("dataFormat", &HighFreqDataType::getDataFormat, &HighFreqDataType::setDataFormat)
            .add_property("address", &HighFreqDataType::getSockAddr, &HighFreqDataType::setSockAddr)
            .add_property("byteSize", &HighFreqDataType::getByteSize, &HighFreqDataType::setByteSize)
            .def("isValid", &HighFreqDataType::isValid)
            .def("print", &HighFreqDataType::print)
            ;

    class_<StimulationCommand>
            ("StimulationCommand", init<>())
//            .def(init<int, int, int, uint16_t, uint8_t, uint16_t, uint8_t, uint16_t, uint16_t, uint16_t>())
            .def("setGroup", &StimulationCommand::setGroup)
            .def("setNoGroup", &StimulationCommand::setNoGroup)
            .def("setSlot", &StimulationCommand::setSlot)
            .def("setChannels",&StimulationCommand::setChannels)
            .def("setBiphasicPulseShape", &StimulationCommand::setBiphasicPulseShape)
            .def("setNumPulsesInTrain", &StimulationCommand::setNumPulsesInTrain)
            .def("isValid", &StimulationCommand::isValid)
            ;

    enum_<GlobalStimulationSettings::CurrentScaling>("CurrentScaling")
            .value("max10nA", GlobalStimulationSettings::max10nA)
            .value("max20nA", GlobalStimulationSettings::max20nA)
            .value("max50nA", GlobalStimulationSettings::max50nA)
            .value("max100nA", GlobalStimulationSettings::max100nA)
            .value("max200nA", GlobalStimulationSettings::max200nA)
            .value("max500nA", GlobalStimulationSettings::max500nA)
            .value("max1uA", GlobalStimulationSettings::max1uA)
            .value("max2uA", GlobalStimulationSettings::max2uA)
            .value("max5uA", GlobalStimulationSettings::max5uA)
            .value("max10uA", GlobalStimulationSettings::max10uA)
            ;

    class_<GlobalStimulationSettings>("GlobalStimulationSettings", init<>())
            .def("setVoltageScale", &GlobalStimulationSettings::setVoltageScale)
            ;

    class_<GlobalStimulationCommand>("GlobalStimulationCommand", init<>())
            .def("setStimEnabled", &GlobalStimulationCommand::setStimEnabled)
            .def("setResetSequencer", &GlobalStimulationCommand::setResetSequencer)
            .def("setAbortStimulation", &GlobalStimulationCommand::setAbortStimulation)
            .def("setClearDSPOffset", &GlobalStimulationCommand::setClearDSPOffset)
            ;
//    void (HighFreqPub::*pubdatax2)(void, size_t) = &HighFreqPub::publishData;
//    void (HighFreqPub::*pubdatax3)(void, size_t, int64_t) = &HighFreqPub::publishData;
//    class_<HighFreqPub, boost::noncopyable>
//            ("HighFreqPub")
//            .def("initialize", &HighFreqPub::initialize)
//            .def("publishData", pubdatax2)
//            .def("publishData", pubdatax3)
//            .def("getAddress", &HighFreqPub::getAddress)
//            ;

    class_<HFSubConsumer_python, boost::noncopyable>
            ("HFSubConsumer", init<HighFreqDataType, int>())
            .def("initialize", &HFSubConsumer_python::initialize)
            .def("readData", static_cast<size_t (HFSubConsumer::*)(np::ndarray)>(&HFSubConsumer_python::readData_python))
            .def("available", &HFSubConsumer_python::available)
            .def("getDataType", &HFSubConsumer_python::getType)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            ;

    class_<HFParsingInfo>("HFParsingInfo")
            .def_readwrite("indices", &HFParsingInfo::indices)
            .def_readwrite("sizeOf", &HFParsingInfo::sizeOf)
            ;

    class_<LFPConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("LFPConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &LFPConsumer_python::initialize)
            .def("getData", &LFPConsumer_python::getData_python)
            .def("available", &LFPConsumer_python::available)
            .def("create_numpy_array", &LFPConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &LFPConsumer_python::getNTrodesRequested)
            ;

    class_<SpikesConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("SpikesConsumer", init<HighFreqDataType, int, HFParsingInfo, int>())
            .def("initialize", &SpikesConsumer_python::initialize)
            .def("getData",&SpikesConsumer_python::getData_python)
            .def("available", &SpikesConsumer_python::available)
            .def("create_numpy_array", &SpikesConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &SpikesConsumer_python::getNTrodesRequested)
            ;

    class_<AnalogConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &AnalogConsumer_python::initialize)
            .def("getData",&AnalogConsumer_python::getData_python)
            .def("available", &AnalogConsumer_python::available)
            .def("create_numpy_array", &AnalogConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &AnalogConsumer::getChannelsRequested)
            ;

    class_<DigitalConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &DigitalConsumer_python::initialize)
            .def("getData",&DigitalConsumer_python::getData_python)
            .def("available", &DigitalConsumer_python::available)
            .def("create_numpy_array", &DigitalConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &DigitalConsumer::getChannelsRequested)
            ;

    class_<NeuralConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("NeuralConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &NeuralConsumer_python::initialize)
            .def("getData",&NeuralConsumer_python::getData_python)
            .def("available", &NeuralConsumer_python::available)
            .def("create_numpy_array", &NeuralConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &NeuralConsumer::getChannelsRequested)
            ;

    class_<PythonModuleClient, boost::noncopyable>
        ("AbstractModuleClient", init<std::string, std::string, int>())
        .def("closeConnections", &PythonModuleClient::close_python)
        .def("recv_acquisition", &AbstractModuleClient::recv_acquisition,&PythonModuleClient::default_recv_acquisition)
        .def("recv_file_open", &AbstractModuleClient::recv_file_open,&PythonModuleClient::default_recv_file_open)
        .def("recv_file_close", &AbstractModuleClient::recv_file_close,&PythonModuleClient::default_recv_file_close)
        .def("recv_source", &AbstractModuleClient::recv_source,&PythonModuleClient::default_recv_source)
        .def("recv_quit", &AbstractModuleClient::recv_quit,&PythonModuleClient::default_recv_quit)
        .def("recv_time", &AbstractModuleClient::recv_time,&PythonModuleClient::default_recv_time)
        .def("recv_timerate", &AbstractModuleClient::recv_timerate,&PythonModuleClient::default_recv_timerate)
        .def("recv_event", &AbstractModuleClient::recv_event,&PythonModuleClient::default_recv_event)
        .def("initialize", &PythonModuleClient::initialize)
        .def("subscribeToEvent", &PythonModuleClient::subscribeToEvent)
        .def("unsubscribeFromEvent", &PythonModuleClient::unsubscribeFromEvent)
        .def("sendMsgToTrodes", &PythonModuleClient::sendMsgToTrodes_python)
        .def("sendMsgToModule", &PythonModuleClient::sendMsgToModule_python)
        .def("sendOutEvent", &PythonModuleClient::sendOutEvent_python)
        .def("sendTimeRequest", &PythonModuleClient::sendTimeRequest)
        .def("sendTimeRateRequest", &PythonModuleClient::sendTimeRateRequest)
        .def("getID", &PythonModuleClient::getID)
        .def("getClients", &PythonModuleClient::getClients)
        .def("registerHighFreqData", &PythonModuleClient::registerHighFreqData)
        .def("deregisterHighFreqData", &PythonModuleClient::deregisterHighFreqData)
        .def("getHighFreqList", &PythonModuleClient::getHighFreqList)
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_python, return_value_policy<manage_new_object>())
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_default_python, return_value_policy<manage_new_object>())
        .def("unsubscribeHighFreqData", &PythonModuleClient::unsubscribeHighFreqData)
        .def("provideEvent", &PythonModuleClient::provideEvent)
        .def("unprovideEvent",&PythonModuleClient::unprovideEvent)
        .def("getEventList", &PythonModuleClient::getEventList)
        .def("subscribeLFPData", &PythonModuleClient::sublfpdata_python, return_value_policy<manage_new_object>())
        .def("subscribeSpikesData", &PythonModuleClient::subspikesdata_python, return_value_policy<manage_new_object>())
        .def("subscribeAnalogData", &PythonModuleClient::subanalogdata_python, return_value_policy<manage_new_object>())
        .def("subscribeDigitalData", &PythonModuleClient::subdigitaldata_python, return_value_policy<manage_new_object>())
        .def("subscribeNeuralData", &PythonModuleClient::subneuraldata_python, return_value_policy<manage_new_object>())
        .def("getAvailableTrodesData", &PythonModuleClient::getAvailableTrodesData)
        .def("initializeHardwareConnection", &PythonModuleClient::initializeHardwareConnection)
        .def("destroyHardwareConnection", &PythonModuleClient::destroyHardwareConnection)
        .def("sendSettleCommand", &PythonModuleClient::sendSettleCommand)
        .def("sendStimulationParams", &PythonModuleClient::sendStimulationParams)
        .def("sendClearStimulationParams", &PythonModuleClient::sendClearStimulationParams)
        .def("sendStimulationStartSlot", &PythonModuleClient::sendStimulationStartSlot)
        .def("sendStimulationStartGroup",&PythonModuleClient::sendStimulationStartGroup)
        .def("sendStimulationStopSlot", &PythonModuleClient::sendStimulationStopSlot)
        .def("sendStimulationStopGroup",&PythonModuleClient::sendStimulationStopGroup)
        .def("sendGlobalStimulationSettings", &PythonModuleClient::sendGlobalStimulationSettings)
        .def("sendGlobalStimulationCommand", &PythonModuleClient::sendGlobalStimulationCommand)
        .def("sendStateScriptShortcutMessage", &PythonModuleClient::sendStateScriptShortcutMessage)
        .def("latestTrodesTimestamp", &PythonModuleClient::latestTrodesTimestamp)
        .def("sendAnnotationRequest", &PythonModuleClient::sendAnnotationRequest)
        ;
}